

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O3

string * __thiscall
gog::(anonymous_namespace)::get_verb_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,extract_options *o)

{
  size_t sVar1;
  string *extraout_RAX;
  char *__s;
  
  if (this[8] == (_anonymous_namespace_)0x0) {
    if (this[7] == (_anonymous_namespace_)0x0) {
      __s = "inspect";
      if (this[6] != (_anonymous_namespace_)0x0) {
        __s = "list the contents of";
      }
    }
    else {
      __s = "test";
    }
  }
  else {
    __s = "extract";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return extraout_RAX;
}

Assistant:

std::string get_verb(const extract_options & o) {
	const char * verb = "inspect";
	if(o.extract) {
		verb = "extract";
	} else if(o.test) {
		verb = "test";
	} else if(o.list) {
		verb = "list the contents of";
	}
	return verb;
}